

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O3

void __thiscall
TPZTensor<double>::ComputeEigenvectors(TPZTensor<double> *this,TPZDecomposed *eigensystem)

{
  double dVar1;
  double *pdVar2;
  TPZManVector<double,_3> *pTVar3;
  uint i;
  long lVar4;
  long lVar5;
  uint i_3;
  long lVar6;
  long lVar7;
  long lVar8;
  uint i_1;
  uint lambda;
  REAL realTol;
  double dVar9;
  TPZTensor<double> A;
  REAL conditionFactor;
  TPZDecomposed eigensystemTemp;
  TPZTensor<double> local_2e8;
  REAL local_290;
  TPZDecomposed local_288;
  
  if (eigensystem->fDistinctEigenvalues == 0) {
    ComputeEigenvalues(this,eigensystem,true);
  }
  else {
    local_2e8.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)&local_288,3,(double *)&local_2e8);
    TPZManVector<double,_3>::operator=
              ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore,
               (TPZManVector<double,_3> *)&local_288);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)&local_288);
    local_2e8.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)&local_288,3,(double *)&local_2e8);
    TPZManVector<double,_3>::operator=
              ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 1,
               (TPZManVector<double,_3> *)&local_288);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)&local_288);
    local_2e8.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)&local_288,3,(double *)&local_2e8);
    TPZManVector<double,_3>::operator=
              ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 2,
               (TPZManVector<double,_3> *)&local_288);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)&local_288);
    if (1 < eigensystem->fDistinctEigenvalues - 2) {
      if (eigensystem->fDistinctEigenvalues == 1) {
        pTVar3 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
        *(pTVar3->super_TPZVec<double>).fStore = 1.0;
        pTVar3[1].super_TPZVec<double>.fStore[1] = 1.0;
        pTVar3[2].super_TPZVec<double>.fStore[2] = 1.0;
        return;
      }
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZTensor.h"
                 ,0x551);
    }
    pdVar2 = (this->fData).super_TPZVec<double>.fStore;
    dVar9 = 0.0;
    lVar4 = 0;
    do {
      dVar9 = dVar9 + pdVar2[lVar4] * pdVar2[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    dVar9 = pdVar2[4] * pdVar2[4] + pdVar2[2] * pdVar2[2] + pdVar2[1] * pdVar2[1] + dVar9;
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    dVar9 = dVar9 * 1e-12;
    pdVar2 = (this->fData).super_TPZVec<double>.fStore;
    if (((dVar9 < ABS(pdVar2[1])) || (dVar9 < ABS(pdVar2[2]))) || (dVar9 < ABS(pdVar2[4]))) {
      TPZDecomposed::TPZDecomposed(&local_288,eigensystem);
      local_2e8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_01877730;
      TPZVec<double>::TPZVec(&local_2e8.fData.super_TPZVec<double>,0);
      pdVar2 = local_2e8.fData.fExtAlloc;
      local_2e8.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01877af0;
      local_2e8.fData.super_TPZVec<double>.fNElements = 6;
      local_2e8.fData.super_TPZVec<double>.fNAlloc = 0;
      local_2e8.fData.fExtAlloc[0] = 0.0;
      local_2e8.fData.fExtAlloc[1] = 0.0;
      local_2e8.fData.fExtAlloc[2] = 0.0;
      local_2e8.fData.fExtAlloc[3] = 0.0;
      local_2e8.fData.fExtAlloc[4] = 0.0;
      local_2e8.fData.fExtAlloc[5] = 0.0;
      local_2e8.fData.super_TPZVec<double>.fStore = pdVar2;
      Precondition(this,&local_290,&local_2e8,&local_288);
      ComputeEigenvectorsInternal(&local_2e8,&local_288);
      TPZManVector<TPZManVector<double,_3>,_3>::operator=
                (&eigensystem->fEigenvectors,&local_288.fEigenvectors);
      local_2e8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_01877730;
      if (local_2e8.fData.super_TPZVec<double>.fStore != pdVar2) {
        local_2e8.fData.super_TPZVec<double>.fNAlloc = 0;
        local_2e8.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
        if (local_2e8.fData.super_TPZVec<double>.fStore != (double *)0x0) {
          operator_delete__(local_2e8.fData.super_TPZVec<double>.fStore);
        }
      }
      TPZManVector<TPZTensor<double>,_3>::~TPZManVector(&local_288.fEigentensors);
      TPZManVector<TPZManVector<double,_3>,_3>::~TPZManVector(&local_288.fEigenvectors);
      TPZManVector<double,_3>::~TPZManVector(&local_288.fEigenvalues);
      if (local_288.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fStore !=
          local_288.fGeometricMultiplicity.fExtAlloc) {
        local_288.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fNAlloc = 0;
        local_288.fGeometricMultiplicity.super_TPZVec<unsigned_int>._vptr_TPZVec =
             (_func_int **)&PTR__TPZVec_01877960;
        if (local_288.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fStore != (uint *)0x0) {
          operator_delete__(local_288.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fStore);
        }
      }
    }
    else {
      lVar4 = 0;
      do {
        lVar5 = 5;
        lVar6 = 4;
        lVar8 = 0;
        lVar7 = 0;
        while (dVar9 < ABS((eigensystem->fEigenvalues).super_TPZVec<double>.fStore[lVar4] -
                           *(double *)
                            ((long)(this->fData).super_TPZVec<double>.fStore + lVar7 * 8 + lVar8 * 4
                            ))) {
          lVar7 = lVar7 + 1;
          lVar5 = lVar5 + -1;
          lVar8 = lVar8 + lVar6;
          lVar6 = lVar6 + -2;
          if (lVar5 == 2) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZTensor.h"
                       ,0x543);
          }
        }
        (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore[lVar4].
        super_TPZVec<double>.fStore[lVar7] = 1.0;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
    }
  }
  pTVar3 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
  lVar4 = 0;
  do {
    lVar5 = 0;
    dVar9 = 0.0;
    do {
      dVar1 = pTVar3[lVar4].super_TPZVec<double>.fStore[lVar5];
      dVar9 = dVar9 + dVar1 * dVar1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    pTVar3 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
    pdVar2 = pTVar3[lVar4].super_TPZVec<double>.fStore;
    lVar5 = 0;
    do {
      pdVar2[lVar5] = pdVar2[lVar5] / dVar9;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  return;
}

Assistant:

void TPZTensor<T>::ComputeEigenvectors(TPZDecomposed &eigensystem) const {
    // Eigenvalues not computed yet. Let's do it.
    if (eigensystem.fDistinctEigenvalues == 0) {
        ComputeEigenvalues(eigensystem, true);
    } else {
        eigensystem.fEigenvectors[0] = TPZManVector<T, 3>(3, 0.);
        eigensystem.fEigenvectors[1] = TPZManVector<T, 3>(3, 0.);
        eigensystem.fEigenvectors[2] = TPZManVector<T, 3>(3, 0.);
        switch (eigensystem.fDistinctEigenvalues) {
            case 1:
                eigensystem.fEigenvectors[0][0] = 1.;
                eigensystem.fEigenvectors[1][1] = 1.;
                eigensystem.fEigenvectors[2][2] = 1.;
                return;
            case 2:
            case 3:
            {
                T tol = Norm()*1.e-12;
                if (IsDiagonal(tol)) {
                    for (unsigned int i = 0; i < 3; ++i) {
                        unsigned int j;
                        for (j = 0; j < 3; ++j) {
                            if (AreEqual(eigensystem.fEigenvalues[i], this->operator()(j, j), tol)) {
                                eigensystem.fEigenvectors[i][j] = 1;
                                break;
                            }
                        }
                        if (j == 3) {
                            DebugStop();
                        }
                    }
                } else {
                    REAL conditionFactor;
                    TPZDecomposed eigensystemTemp = eigensystem;
                    TPZTensor<T> A;
                    Precondition(conditionFactor, A, eigensystemTemp);
                    A.ComputeEigenvectorsInternal(eigensystemTemp);
                    eigensystem.fEigenvectors = eigensystemTemp.fEigenvectors;
                }
                break;
            }
            default:
                DebugStop();
        }
    }


    for (unsigned int lambda = 0; lambda < 3; ++lambda) {
        REAL Norm = 0.;
        for (unsigned int i = 0; i < 3; ++i) {
            Norm += pow(TPZExtractVal::val(eigensystem.fEigenvectors[lambda][i]), 2);
        }
        Norm = sqrt(Norm);
        for (unsigned int i = 0; i < 3; ++i) {
            eigensystem.fEigenvectors[lambda][i] /= Norm;
        }
    }
}